

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintRawArrayTo<nsh_cmd>(nsh_cmd *a,size_t count,ostream *os)

{
  long lVar1;
  nsh_cmd *value;
  bool bVar2;
  
  RawBytesPrinter::PrintValue<nsh_cmd,24ul>(a,os);
  value = a + 1;
  lVar1 = count - 1;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    std::operator<<(os,", ");
    RawBytesPrinter::PrintValue<nsh_cmd,24ul>(value,os);
    value = value + 1;
  }
  return;
}

Assistant:

void PrintRawArrayTo(const T a[], size_t count, ::std::ostream* os) {
  UniversalPrint(a[0], os);
  for (size_t i = 1; i != count; i++) {
    *os << ", ";
    UniversalPrint(a[i], os);
  }
}